

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::pack::Atlas::addCharts(Atlas *this,TaskScheduler *taskScheduler,Atlas *paramAtlas)

{
  Chart *pCVar1;
  ChartGroup *pCVar2;
  AddChartTaskArgs *pAVar3;
  Chart *pCVar4;
  Chart **ppCVar5;
  uint32_t i;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t newSize;
  Array<xatlas::internal::pack::Chart_*> *this_00;
  uint32_t j;
  uint32_t i_00;
  uint32_t index;
  Task task;
  ThreadLocal<xatlas::internal::BoundingBox2D> boundingBox;
  TaskGroupHandle taskGroup;
  Array<xatlas::internal::pack::AddChartTaskArgs> taskArgs;
  ThreadLocal<xatlas::internal::BoundingBox2D> local_78;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  TaskGroupHandle local_60;
  uint32_t local_5c;
  Atlas *local_58;
  Atlas *local_50;
  ArrayBase local_48;
  
  uVar7 = (paramAtlas->m_chartGroups).m_base.size;
  newSize = 0;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pCVar2 = param::Atlas::chartGroupAt(paramAtlas,uVar6);
    if (pCVar2->m_isVertexMap == false) {
      newSize = newSize + (pCVar2->m_charts).m_base.size;
    }
  }
  if (newSize != 0) {
    local_48.buffer = (uint8_t *)0x0;
    local_48.elementSize = 0x18;
    local_48.size = 0;
    local_48.capacity = 0;
    Array<xatlas::internal::pack::AddChartTaskArgs>::resize
              ((Array<xatlas::internal::pack::AddChartTaskArgs> *)&local_48,newSize);
    local_60 = TaskScheduler::createTaskGroup(taskScheduler,newSize);
    local_5c = local_60.value;
    local_58 = this;
    ThreadLocal<xatlas::internal::BoundingBox2D>::ThreadLocal(&local_78);
    uVar6 = 0;
    local_6c = newSize;
    local_68 = uVar7;
    local_50 = paramAtlas;
    uVar7 = 0;
    while (uVar6 != local_68) {
      local_64 = uVar6;
      pCVar2 = param::Atlas::chartGroupAt(paramAtlas,uVar6);
      index = uVar7;
      if (pCVar2->m_isVertexMap == false) {
        uVar6 = (pCVar2->m_charts).m_base.size;
        for (i_00 = 0; index = uVar7 + i_00, paramAtlas = local_50, newSize = local_6c,
            uVar6 != i_00; i_00 = i_00 + 1) {
          pAVar3 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                             ((Array<xatlas::internal::pack::AddChartTaskArgs> *)&local_48,index);
          pAVar3->boundingBox = &local_78;
          pCVar4 = param::ChartGroup::chartAt(pCVar2,i_00);
          pAVar3->paramChart = pCVar4;
          pAVar3 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                             ((Array<xatlas::internal::pack::AddChartTaskArgs> *)&local_48,index);
          task.userData = pAVar3;
          task.func = runAddChartTask;
          TaskScheduler::run(taskScheduler,local_60,task);
        }
      }
      uVar7 = index;
      uVar6 = local_64 + 1;
    }
    TaskScheduler::wait(taskScheduler,&local_5c);
    this_00 = &local_58->m_charts;
    Array<xatlas::internal::pack::Chart_*>::resize(this_00,newSize);
    for (uVar7 = 0; newSize != uVar7; uVar7 = uVar7 + 1) {
      pAVar3 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                         ((Array<xatlas::internal::pack::AddChartTaskArgs> *)&local_48,uVar7);
      pCVar1 = pAVar3->chart;
      ppCVar5 = Array<xatlas::internal::pack::Chart_*>::operator[](this_00,uVar7);
      *ppCVar5 = pCVar1;
    }
    ThreadLocal<xatlas::internal::BoundingBox2D>::~ThreadLocal(&local_78);
    ArrayBase::~ArrayBase(&local_48);
  }
  return;
}

Assistant:

void addCharts(TaskScheduler *taskScheduler, param::Atlas *paramAtlas)
	{
		// Count charts.
		uint32_t chartCount = 0;
		const uint32_t chartGroupsCount = paramAtlas->chartGroupCount();
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			chartCount += chartGroup->chartCount();
		}
		if (chartCount == 0)
			return;
		// Run one task per chart.
		Array<AddChartTaskArgs> taskArgs;
		taskArgs.resize(chartCount);
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartCount);
		uint32_t chartIndex = 0;
		ThreadLocal<BoundingBox2D> boundingBox;
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			const uint32_t count = chartGroup->chartCount();
			for (uint32_t j = 0; j < count; j++) {
				AddChartTaskArgs &args = taskArgs[chartIndex];
				args.boundingBox = &boundingBox;
				args.paramChart = chartGroup->chartAt(j);
				Task task;
				task.userData = &taskArgs[chartIndex];
				task.func = runAddChartTask;
				taskScheduler->run(taskGroup, task);
				chartIndex++;
			}
		}
		taskScheduler->wait(&taskGroup);
		// Get task output.
		m_charts.resize(chartCount);
		for (uint32_t i = 0; i < chartCount; i++)
			m_charts[i] = taskArgs[i].chart;
	}